

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_cookie_clearall(CookieInfo *ci)

{
  Curl_llist_node *n;
  Cookie *co;
  Curl_llist_node *pCVar1;
  long lVar2;
  
  if (ci != (CookieInfo *)0x0) {
    for (lVar2 = 0; lVar2 != 0x3f; lVar2 = lVar2 + 1) {
      n = Curl_llist_head(ci->cookielist + lVar2);
      while (n != (Curl_llist_node *)0x0) {
        co = (Cookie *)Curl_node_elem(n);
        pCVar1 = Curl_node_next(n);
        Curl_node_remove(n);
        freecookie(co);
        n = pCVar1;
      }
    }
    ci->numcookies = 0;
  }
  return;
}

Assistant:

void Curl_cookie_clearall(struct CookieInfo *ci)
{
  if(ci) {
    unsigned int i;
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      struct Curl_llist_node *n;
      for(n = Curl_llist_head(&ci->cookielist[i]); n;) {
        struct Cookie *c = Curl_node_elem(n);
        struct Curl_llist_node *e = Curl_node_next(n);
        Curl_node_remove(n);
        freecookie(c);
        n = e;
      }
    }
    ci->numcookies = 0;
  }
}